

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O1

bool __thiscall
glcts::DrawBuffersIndexedBlending::VerifyImg
          (DrawBuffersIndexedBlending *this,TextureLevel *textureLevel,RGBA expectedColor,
          RGBA epsilon)

{
  ostringstream *this_00;
  int iVar1;
  bool bVar2;
  ChannelOrder CVar3;
  RGBA RVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  ChannelOrder CVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  RGBA pixel;
  bool local_201;
  int local_200;
  RGBA local_1ec;
  uint local_1e8;
  uint local_1e4;
  uint local_1e0;
  uint local_1dc;
  RGBA local_1d8;
  deUint32 local_1d4;
  TextureLevel *local_1d0;
  DrawBuffersIndexedBlending *local_1c8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar13 = (textureLevel->m_size).m_data[1];
  local_201 = iVar13 < 1;
  if (0 < iVar13) {
    uVar11 = expectedColor.m_value >> 8 & 0xff;
    uVar12 = expectedColor.m_value >> 0x10 & 0xff;
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1dc = epsilon.m_value & 0xff;
    local_1e0 = epsilon.m_value >> 8 & 0xff;
    local_1e4 = epsilon.m_value >> 0x10 & 0xff;
    local_1e8 = epsilon.m_value >> 0x18;
    local_200 = 0;
    local_1d8.m_value = epsilon.m_value;
    local_1d4 = expectedColor.m_value;
    local_1d0 = textureLevel;
    local_1c8 = this;
    do {
      iVar13 = (textureLevel->m_size).m_data[0];
      bVar2 = 0 < iVar13;
      if (0 < iVar13) {
        iVar13 = 0;
        do {
          tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,textureLevel);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1c0,(int)(ConstPixelBufferAccess *)local_1b0,
                     iVar13,local_200);
          tcu::RGBA::RGBA(&local_1ec,(Vec4 *)local_1c0);
          bVar5 = true;
          if (local_1ec.m_value != local_1d4) {
            CVar8 = (local_1ec.m_value & 0xff) - (expectedColor.m_value & 0xff);
            CVar3 = -CVar8;
            if (0 < (int)CVar8) {
              CVar3 = CVar8;
            }
            iVar9 = (local_1ec.m_value >> 8 & 0xff) - uVar11;
            iVar1 = -iVar9;
            if (0 < iVar9) {
              iVar1 = iVar9;
            }
            iVar10 = (local_1ec.m_value >> 0x10 & 0xff) - uVar12;
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            iVar6 = (local_1ec.m_value >> 0x18) - (expectedColor.m_value >> 0x18);
            iVar10 = -iVar6;
            if (0 < iVar6) {
              iVar10 = iVar6;
            }
            local_1b0._0_4_ = iVar9 << 0x10 | iVar1 << 8 | iVar10 << 0x18 | CVar3;
            bVar5 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,local_1d8);
          }
          if (bVar5 == false) {
            local_1b0._0_8_ =
                 ((local_1c8->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Expected value: ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"RGBA(",5);
            poVar7 = (ostream *)std::ostream::operator<<(this_00,expectedColor.m_value & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,expectedColor.m_value >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Read value:     ",0x10);
            RVar4.m_value = local_1ec.m_value;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"RGBA(",5);
            poVar7 = (ostream *)std::ostream::operator<<(this_00,RVar4.m_value & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,RVar4.m_value >> 8 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,RVar4.m_value >> 0x10 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,RVar4.m_value >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Epsilon:        ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"RGBA(",5);
            poVar7 = (ostream *)std::ostream::operator<<(this_00,local_1dc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1e4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            textureLevel = local_1d0;
            if (bVar2) {
              return local_201;
            }
            break;
          }
          iVar13 = iVar13 + 1;
          iVar1 = (local_1d0->m_size).m_data[0];
          bVar2 = iVar13 < iVar1;
          textureLevel = local_1d0;
        } while (iVar13 < iVar1);
      }
      local_200 = local_200 + 1;
      iVar13 = (textureLevel->m_size).m_data[1];
      local_201 = iVar13 <= local_200;
    } while (local_200 < iVar13);
  }
  return local_201;
}

Assistant:

bool DrawBuffersIndexedBlending::VerifyImg(const tcu::TextureLevel& textureLevel, tcu::RGBA expectedColor,
										   tcu::RGBA epsilon)
{
	for (int y = 0; y < textureLevel.getHeight(); ++y)
	{
		for (int x = 0; x < textureLevel.getWidth(); ++x)
		{
			tcu::RGBA pixel(textureLevel.getAccess().getPixel(x, y));
			if (!tcu::compareThreshold(pixel, expectedColor, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Expected value: " << expectedColor << "\n"
								   << "Read value:     " << pixel << "\n"
								   << "Epsilon:        " << epsilon << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}
	return true;
}